

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load_raw<char>(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *this,enable_if_t<std::is_same<char,_char>::value,_handle> src)

{
  int iVar1;
  PyObject **ppPVar2;
  char *pcVar3;
  ulong uVar4;
  allocator local_89;
  string local_88 [32];
  char *local_68;
  char *bytearray;
  allocator local_49;
  string local_48 [32];
  char *local_28;
  char *bytes;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this_local;
  enable_if_t<std::is_same<char,_char>::value,_handle> src_local;
  
  bytes = (char *)this;
  this_local = (string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)src.m_ptr;
  ppPVar2 = handle::ptr((handle *)&this_local);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x8000000);
  if (iVar1 == 0) {
    ppPVar2 = handle::ptr((handle *)&this_local);
    iVar1 = _PyObject_TypeCheck(*ppPVar2,(PyTypeObject *)&PyByteArray_Type);
    if (iVar1 == 0) {
      src_local.m_ptr._7_1_ = false;
    }
    else {
      ppPVar2 = handle::ptr((handle *)&this_local);
      pcVar3 = (char *)PyByteArray_AsString(*ppPVar2);
      local_68 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pybind11_fail("Unexpected PyByteArray_AsString() failure.");
      }
      ppPVar2 = handle::ptr((handle *)&this_local);
      uVar4 = PyByteArray_Size(*ppPVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,pcVar3,uVar4,&local_89);
      std::__cxx11::string::operator=((string *)this,local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      src_local.m_ptr._7_1_ = true;
    }
  }
  else {
    ppPVar2 = handle::ptr((handle *)&this_local);
    pcVar3 = (char *)PyBytes_AsString(*ppPVar2);
    local_28 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pybind11_fail("Unexpected PYBIND11_BYTES_AS_STRING() failure.");
    }
    ppPVar2 = handle::ptr((handle *)&this_local);
    uVar4 = PyBytes_Size(*ppPVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar3,uVar4,&local_49);
    std::__cxx11::string::operator=((string *)this,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    src_local.m_ptr._7_1_ = true;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load_raw(enable_if_t<std::is_same<C, char>::value, handle> src) {
        if (PYBIND11_BYTES_CHECK(src.ptr())) {
            // We were passed raw bytes; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytes = PYBIND11_BYTES_AS_STRING(src.ptr());
            if (!bytes) {
                pybind11_fail("Unexpected PYBIND11_BYTES_AS_STRING() failure.");
            }
            value = StringType(bytes, (size_t) PYBIND11_BYTES_SIZE(src.ptr()));
            return true;
        }
        if (PyByteArray_Check(src.ptr())) {
            // We were passed a bytearray; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytearray = PyByteArray_AsString(src.ptr());
            if (!bytearray) {
                pybind11_fail("Unexpected PyByteArray_AsString() failure.");
            }
            value = StringType(bytearray, (size_t) PyByteArray_Size(src.ptr()));
            return true;
        }

        return false;
    }